

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<int,_false>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<int,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_false>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  undefined4 *__s;
  internal_node<int,_false> *p_node;
  byte bVar1;
  tree_node<int,_false> *ptVar2;
  internal_node<int,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  undefined4 *puVar5;
  uint32_t uVar6;
  ulong uVar7;
  char *__function;
  undefined4 in_register_00000084;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ref<immutable::rrb_details::tree_node<int,_false>_> right_hand_node;
  ref<immutable::rrb_details::tree_node<int,_false>_> internal_root_child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_78;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_70;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_68;
  uint32_t *local_60;
  undefined8 local_58;
  tree_node<int,_false> *local_50;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_48;
  size_t local_40;
  rrb_size_table<false> *local_38;
  
  local_58 = CONCAT44(in_register_00000084,shift);
  bVar1 = (byte)shift & 0x1f;
  uVar10 = right >> bVar1;
  p_node = (internal_node<int,_false> *)root->ptr;
  if (shift == 0) {
    if (p_node != (internal_node<int,_false> *)0x0) {
      p_node->_ref_count = p_node->_ref_count + 1;
    }
    uVar9 = (ulong)(uVar10 + 1);
    local_50 = (tree_node<int,_false> *)this;
    puVar5 = (undefined4 *)malloc(uVar9 * 4 + 0x18);
    __s = puVar5 + 6;
    puVar5[1] = uVar10 + 1;
    *puVar5 = 0;
    *(undefined4 **)(puVar5 + 4) = __s;
    puVar5[3] = 0;
    if (uVar10 + 1 == 0) {
      puVar5[2] = 1;
    }
    else {
      memset(__s,0,uVar9 * 4);
      puVar5[2] = 1;
      if (p_node == (internal_node<int,_false> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
        ;
        goto LAB_00148c36;
      }
      prVar4 = (p_node->size_table).ptr;
      uVar7 = 0;
      do {
        __s[uVar7] = *(undefined4 *)((long)&prVar4->size + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    ptVar2 = local_50;
    *total_shift = 0;
    *(undefined4 **)local_50 = puVar5;
    if (p_node == (internal_node<int,_false> *)0x0) {
      return (ref<immutable::rrb_details::tree_node<int,_false>_>)local_50;
    }
    uVar6 = p_node->_ref_count;
    p_node->_ref_count = uVar6 - 1;
    if (uVar6 != 1) {
      return (ref<immutable::rrb_details::tree_node<int,_false>_>)local_50;
    }
    free(p_node);
    return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar2;
  }
  if (p_node == (internal_node<int,_false> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
    ;
LAB_00148c36:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  p_node->_ref_count = p_node->_ref_count + 1;
  prVar4 = (p_node->size_table).ptr;
  if (prVar4 == (rrb_size_table<false> *)0x0) {
    uVar9 = (ulong)uVar10;
    local_70.ptr = (tree_node<int,_false> *)p_node->child[uVar9].ptr;
    if ((internal_node<int,_false> *)local_70.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)local_70.ptr)->_ref_count =
           ((internal_node<int,_false> *)local_70.ptr)->_ref_count + 1;
    }
    local_60 = total_shift;
    rrb_drop_right_rec<int,false,6>
              ((rrb_details *)&local_78,total_shift,&local_70,
               right - (uVar10 << ((byte)shift & 0x1f)),shift - 6,right >> bVar1 != 0 || has_left);
    if (right >> bVar1 != 0) {
      uVar10 = uVar10 + 1;
      piVar3 = (internal_node<int,_false> *)malloc((ulong)uVar10 * 8 + 0x20);
      piVar3->len = uVar10;
      piVar3->type = INTERNAL_NODE;
      (piVar3->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar3->guid = 0;
      piVar3->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar3 + 1);
      lVar8 = 0;
      memset(piVar3 + 1,0,(ulong)uVar10 * 8);
      piVar3->_ref_count = 1;
      do {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar3->child->ptr + lVar8),
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&p_node->child->ptr + lVar8));
        lVar8 = lVar8 + 8;
      } while (uVar9 * 8 != lVar8);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar3->child + uVar9),
                 &local_78);
      *local_60 = (uint32_t)local_58;
      *(internal_node<int,_false> **)this = piVar3;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      release<int>(piVar3);
      goto LAB_00148bde;
    }
    if (has_left) {
      piVar3 = (internal_node<int,_false> *)malloc(0x28);
      piVar3->type = INTERNAL_NODE;
      piVar3->len = 1;
      (piVar3->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar3->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar3 + 1);
      piVar3[1].type = LEAF_NODE;
      piVar3[1].len = 0;
      piVar3->_ref_count = 1;
      piVar3->guid = 0;
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar3 + 1),&local_78);
      *local_60 = (uint32_t)local_58;
      *(internal_node<int,_false> **)this = piVar3;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      release<int>(piVar3);
      goto LAB_00148bde;
    }
  }
  else {
    uVar9 = (ulong)(uVar10 - 1);
    do {
      uVar7 = uVar9;
      iVar11 = (int)uVar7;
      uVar10 = iVar11 + 1;
      uVar9 = (ulong)uVar10;
    } while (prVar4->size[uVar9] <= right);
    uVar6 = right;
    if (uVar10 != 0) {
      uVar6 = right - prVar4->size[uVar7];
    }
    local_70.ptr = (tree_node<int,_false> *)p_node->child[uVar9].ptr;
    if ((internal_node<int,_false> *)local_70.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)local_70.ptr)->_ref_count =
           ((internal_node<int,_false> *)local_70.ptr)->_ref_count + 1;
    }
    local_38 = prVar4;
    rrb_drop_right_rec<int,false,6>
              ((rrb_details *)&local_78,total_shift,&local_70,uVar6,shift - 6,
               uVar10 != 0 || has_left);
    if (uVar10 != 0) {
      uVar10 = iVar11 + 2;
      uVar7 = (ulong)uVar10;
      local_40 = uVar7 * 8;
      local_60 = total_shift;
      local_50 = (tree_node<int,_false> *)this;
      piVar3 = (internal_node<int,_false> *)malloc(uVar7 * 8 + 0x20);
      piVar3->len = uVar10;
      piVar3->type = INTERNAL_NODE;
      local_48 = &piVar3->size_table;
      (piVar3->size_table).ptr = (rrb_size_table<false> *)0x0;
      lVar8 = 0;
      piVar3->guid = 0;
      piVar3->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar3 + 1);
      memset(piVar3 + 1,0,local_40);
      piVar3->_ref_count = 1;
      prVar4 = (rrb_size_table<false> *)malloc(uVar7 * 4 + 0x10);
      prVar4->size = (uint32_t *)(prVar4 + 1);
      prVar4->guid = 0;
      prVar4->_ref_count = 1;
      local_68.ptr = prVar4;
      memcpy(prVar4 + 1,local_38->size,uVar9 * 4);
      *(uint32_t *)((long)&prVar4[1].size + uVar9 * 4) = right + 1;
      do {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar3->child->ptr + lVar8),
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&p_node->child->ptr + lVar8));
        lVar8 = lVar8 + 8;
      } while (uVar9 << 3 != lVar8);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(local_48,&local_68);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar3->child + uVar9),
                 &local_78);
      this = (rrb_details *)local_50;
      *local_60 = (uint32_t)local_58;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      *(internal_node<int,_false> **)local_50 = piVar3;
      if ((local_68.ptr != (rrb_size_table<false> *)0x0) &&
         (uVar6 = (local_68.ptr)->_ref_count, (local_68.ptr)->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_68.ptr);
      }
      release<int>(piVar3);
      goto LAB_00148bde;
    }
    if (has_left) {
      piVar3 = (internal_node<int,_false> *)malloc(0x28);
      piVar3->type = INTERNAL_NODE;
      piVar3->len = 1;
      (piVar3->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar3->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar3 + 1);
      piVar3[1].type = LEAF_NODE;
      piVar3[1].len = 0;
      piVar3->_ref_count = 1;
      piVar3->guid = 0;
      local_68.ptr = (rrb_size_table<false> *)malloc(0x14);
      (local_68.ptr)->size = (uint32_t *)(local_68.ptr + 1);
      (local_68.ptr)->guid = 0;
      (local_68.ptr)->_ref_count = 1;
      *(uint32_t *)&local_68.ptr[1].size = right + 1;
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(&piVar3->size_table,&local_68);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar3->child,&local_78);
      *total_shift = (uint32_t)local_58;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      *(internal_node<int,_false> **)this = piVar3;
      if ((local_68.ptr != (rrb_size_table<false> *)0x0) &&
         (uVar6 = (local_68.ptr)->_ref_count, (local_68.ptr)->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_68.ptr);
      }
      release<int>(piVar3);
      goto LAB_00148bde;
    }
  }
  *(tree_node<int,_false> **)this = local_78.ptr;
  if (local_78.ptr != (tree_node<int,_false> *)0x0) {
    (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
  }
LAB_00148bde:
  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_78);
  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_70);
  release<int>(p_node);
  return (ref<immutable::rrb_details::tree_node<int,_false>_>)(tree_node<int,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }